

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_engine.cpp
# Opt level: O0

int __thiscall
zmq::udp_engine_t::set_udp_multicast_iface
          (udp_engine_t *this,fd_t s_,bool is_ipv6_,udp_address_t *addr_)

{
  ip_addr_t *piVar1;
  udp_address_t *in_RCX;
  undefined1 in_DL;
  int in_ESI;
  in_addr bind_addr;
  int bind_if;
  int rc;
  uint32_t local_24;
  int local_20;
  int local_1c;
  undefined3 in_stack_fffffffffffffff0;
  uint rc_;
  
  rc_ = CONCAT13(in_DL,in_stack_fffffffffffffff0) & 0x1ffffff;
  local_1c = 0;
  if ((char)(rc_ >> 0x18) == '\0') {
    piVar1 = udp_address_t::bind_addr(in_RCX);
    local_24 = (piVar1->ipv6).sin6_flowinfo;
    if (local_24 != 0) {
      local_1c = setsockopt(in_ESI,0,0x20,&local_24,4);
    }
  }
  else {
    local_20 = udp_address_t::bind_if(in_RCX);
    if (0 < local_20) {
      local_1c = setsockopt(in_ESI,0x29,0x11,&local_20,4);
    }
  }
  assert_success_or_recoverable(in_ESI,rc_);
  return local_1c;
}

Assistant:

int zmq::udp_engine_t::set_udp_multicast_iface (fd_t s_,
                                                bool is_ipv6_,
                                                const udp_address_t *addr_)
{
    int rc = 0;

    if (is_ipv6_) {
        int bind_if = addr_->bind_if ();

        if (bind_if > 0) {
            //  If a bind interface is provided we tell the
            //  kernel to use it to send multicast packets
            rc = setsockopt (s_, IPPROTO_IPV6, IPV6_MULTICAST_IF,
                             reinterpret_cast<char *> (&bind_if),
                             sizeof (bind_if));
        }
    } else {
        struct in_addr bind_addr = addr_->bind_addr ()->ipv4.sin_addr;

        if (bind_addr.s_addr != INADDR_ANY) {
            rc = setsockopt (s_, IPPROTO_IP, IP_MULTICAST_IF,
                             reinterpret_cast<char *> (&bind_addr),
                             sizeof (bind_addr));
        }
    }

    assert_success_or_recoverable (s_, rc);
    return rc;
}